

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  int *piVar1;
  undefined8 *puVar2;
  ImGuiWindow *pIVar3;
  ImGuiTable *table;
  ImGuiListClipperData *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  ImGuiListClipperData *pIVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((GImGui->DebugLogFlags & 0x10) != 0) {
    ImGui::DebugLog("Clipper: Begin(%d,%.2f) in \'%s\'\n",SUB84((double)items_height,0),items_count,
                    pIVar3->Name);
  }
  table = pIVar5->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  this->StartPosY = (pIVar3->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = items_count;
  this->DisplayStart = -1;
  this->DisplayEnd = 0;
  iVar10 = pIVar5->ClipperTempDataStacked;
  iVar6 = (pIVar5->ClipperTempData).Size;
  iVar9 = iVar10 + 1;
  pIVar5->ClipperTempDataStacked = iVar9;
  if (iVar6 <= iVar10) {
    iVar11 = (pIVar5->ClipperTempData).Capacity;
    if (iVar11 <= iVar10) {
      if (iVar11 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar11 / 2 + iVar11;
      }
      if (iVar11 <= iVar9) {
        iVar11 = iVar9;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar7 = (ImGuiListClipperData *)
               (*GImAllocatorAllocFunc)((long)iVar11 * 0x28,GImAllocatorUserData);
      pIVar4 = (pIVar5->ClipperTempData).Data;
      if (pIVar4 != (ImGuiListClipperData *)0x0) {
        memcpy(pIVar7,pIVar4,(long)(pIVar5->ClipperTempData).Size * 0x28);
        pIVar4 = (pIVar5->ClipperTempData).Data;
        if ((pIVar4 != (ImGuiListClipperData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar5->ClipperTempData).Data = pIVar7;
      (pIVar5->ClipperTempData).Capacity = iVar11;
      iVar6 = (pIVar5->ClipperTempData).Size;
    }
    if (iVar6 <= iVar10) {
      iVar10 = (iVar10 - iVar6) + 1;
      lVar8 = (long)iVar6 * 0x28;
      do {
        pIVar4 = (pIVar5->ClipperTempData).Data;
        *(undefined8 *)((long)&(pIVar4->Ranges).Data + lVar8) = 0;
        puVar2 = (undefined8 *)((long)&pIVar4->ItemsFrozen + lVar8);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&pIVar4->ListClipper + lVar8);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar8 = lVar8 + 0x28;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    (pIVar5->ClipperTempData).Size = iVar9;
    iVar9 = pIVar5->ClipperTempDataStacked;
  }
  pIVar4 = (pIVar5->ClipperTempData).Data;
  pIVar7 = pIVar4 + (long)iVar9 + -1;
  ImGuiListClipperData::Reset(pIVar7,this);
  pIVar4[(long)iVar9 + -1].LossynessOffset = (pIVar3->DC).CursorStartPosLossyness.y;
  this->TempData = pIVar7;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IMGUI_DEBUG_LOG_CLIPPER("Clipper: Begin(%d,%.2f) in '%s'\n", items_count, items_height, window->Name);

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    DisplayStart = -1;
    DisplayEnd = 0;

    // Acquire temporary buffer
    if (++g.ClipperTempDataStacked > g.ClipperTempData.Size)
        g.ClipperTempData.resize(g.ClipperTempDataStacked, ImGuiListClipperData());
    ImGuiListClipperData* data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
    data->Reset(this);
    data->LossynessOffset = window->DC.CursorStartPosLossyness.y;
    TempData = data;
}